

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::type_name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  FieldDescriptor *descriptor_00;
  FieldDescriptor FVar1;
  int iVar2;
  Descriptor *pDVar3;
  EnumDescriptor *this_00;
  LogMessage *other;
  Descriptor *descriptor_01;
  EnumDescriptor *descriptor_02;
  char *pcVar4;
  char *pcVar5;
  FieldDescriptor *local_60;
  FieldDescriptor *local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40 [2];
  
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_50._0_8_ = FieldDescriptor::TypeOnceInit;
    local_60 = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_50,
               &local_60);
  }
  FVar1 = descriptor[2];
  switch(FVar1) {
  case (FieldDescriptor)0x1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "double";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0x2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "float";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0x3:
  case (FieldDescriptor)0x10:
  case (FieldDescriptor)0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "long";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0x4:
  case (FieldDescriptor)0x6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "ulong";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0x5:
  case (FieldDescriptor)0xf:
  case (FieldDescriptor)0x11:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "int";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0x7:
  case (FieldDescriptor)0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "uint";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0x8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "bool";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0x9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "string";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0xa:
  case (FieldDescriptor)0xb:
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_50._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_50,
                 &local_60);
      FVar1 = descriptor[2];
    }
    if (FVar1 == (FieldDescriptor)0xb) {
      pDVar3 = FieldDescriptor::message_type(descriptor);
      iVar2 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar3 + 0x10));
      if (iVar2 == 0) {
        pDVar3 = FieldDescriptor::message_type(descriptor);
        descriptor_00 = *(FieldDescriptor **)(pDVar3 + 0x28);
        type_name_abi_cxx11_((string *)local_50,this,descriptor_00);
        if (*(once_flag **)(descriptor_00 + 0x18) != (once_flag *)0x0) {
          local_60 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
          local_58 = descriptor_00;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(descriptor_00 + 0x18),
                     (_func_void_FieldDescriptor_ptr **)&local_60,&local_58);
        }
        FVar1 = descriptor_00[2];
        if (FVar1 != (FieldDescriptor)0x9) {
          if (*(once_flag **)(descriptor_00 + 0x18) != (once_flag *)0x0) {
            local_60 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
            local_58 = descriptor_00;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(descriptor_00 + 0x18),
                       (_func_void_FieldDescriptor_ptr **)&local_60,&local_58);
            FVar1 = descriptor_00[2];
          }
          if (FVar1 != (FieldDescriptor)0xc) {
            std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50,"?");
            if ((undefined1 *)local_50._0_8_ == local_50 + 0x10) {
              return __return_storage_ptr__;
            }
            operator_delete((void *)local_50._0_8_);
            return __return_storage_ptr__;
          }
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((undefined1 *)local_50._0_8_ == local_50 + 0x10) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_40[0]._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40[0]._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50._0_8_;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_40[0]._M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = local_50._8_8_;
        return __return_storage_ptr__;
      }
    }
    pDVar3 = FieldDescriptor::message_type(descriptor);
    GetClassName_abi_cxx11_(__return_storage_ptr__,(csharp *)pDVar3,descriptor_01);
    return __return_storage_ptr__;
  case (FieldDescriptor)0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "pb::ByteString";
    pcVar4 = "";
    break;
  case (FieldDescriptor)0xe:
    this_00 = FieldDescriptor::enum_type(descriptor);
    GetClassName_abi_cxx11_(__return_storage_ptr__,(csharp *)this_00,descriptor_02);
    return __return_storage_ptr__;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x105);
    other = internal::LogMessage::operator<<((LogMessage *)local_50,"Unknown field type.");
    internal::LogFinisher::operator=((LogFinisher *)&local_60,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    pcVar5 = pcVar4;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::type_name(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return GetClassName(descriptor->enum_type());
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field =
            descriptor->message_type()->field(0);
        std::string wrapped_field_type_name = type_name(wrapped_field);
        // String and ByteString go to the same type; other wrapped types
        // go to the nullable equivalent.
        if (wrapped_field->type() == FieldDescriptor::TYPE_STRING ||
            wrapped_field->type() == FieldDescriptor::TYPE_BYTES) {
          return wrapped_field_type_name;
        } else {
          return wrapped_field_type_name + "?";
        }
      }
      return GetClassName(descriptor->message_type());
    case FieldDescriptor::TYPE_DOUBLE:
      return "double";
    case FieldDescriptor::TYPE_FLOAT:
      return "float";
    case FieldDescriptor::TYPE_INT64:
      return "long";
    case FieldDescriptor::TYPE_UINT64:
      return "ulong";
    case FieldDescriptor::TYPE_INT32:
      return "int";
    case FieldDescriptor::TYPE_FIXED64:
      return "ulong";
    case FieldDescriptor::TYPE_FIXED32:
      return "uint";
    case FieldDescriptor::TYPE_BOOL:
      return "bool";
    case FieldDescriptor::TYPE_STRING:
      return "string";
    case FieldDescriptor::TYPE_BYTES:
      return "pb::ByteString";
    case FieldDescriptor::TYPE_UINT32:
      return "uint";
    case FieldDescriptor::TYPE_SFIXED32:
      return "int";
    case FieldDescriptor::TYPE_SFIXED64:
      return "long";
    case FieldDescriptor::TYPE_SINT32:
      return "int";
    case FieldDescriptor::TYPE_SINT64:
      return "long";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}